

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printPolicyPureVector.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  long lVar2;
  long in_RSI;
  int in_EDI;
  E *e;
  PolicyPureVector p;
  NullPlanner np;
  PlanningUnitMADPDiscreteParameters params;
  MADPParser parser;
  DecPOMDPDiscrete decpomdp;
  LIndex index;
  int h;
  string dpomdpFile;
  DecPOMDPDiscrete *in_stack_fffffffffffff928;
  MADPParser *in_stack_fffffffffffff930;
  Interface_ProblemToPolicyDiscretePure *pIVar3;
  DecPOMDPDiscreteInterface *local_6c0;
  allocator<char> *in_stack_fffffffffffff960;
  allocator<char> *__a;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  PolicyPureVector local_680 [80];
  NullPlanner local_630 [40];
  Interface_ProblemToPolicyDiscretePure aIStack_608 [789];
  PlanningUnitMADPDiscreteParameters local_2f3 [9];
  MADPParser local_2ea;
  allocator<char> local_2e9;
  string local_2e8 [39];
  allocator<char> local_2c1;
  string local_2c0 [32];
  long local_2a0 [70];
  ulonglong local_70;
  int local_68;
  undefined1 local_51 [33];
  string local_30 [32];
  long local_10;
  int local_4;
  
  local_4 = 0;
  if (in_EDI == 4) {
    __s = *(char **)(in_RSI + 8);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_51;
    local_10 = in_RSI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,__s,in_stack_fffffffffffff960);
    directories::MADPGetProblemFilename(local_30);
    std::__cxx11::string::~string((string *)(local_51 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_51);
    lVar2 = strtol(*(char **)(local_10 + 0x10),(char **)0x0,10);
    local_68 = (int)lVar2;
    local_70 = strtoull(*(char **)(local_10 + 0x18),(char **)0x0,10);
    __a = &local_2c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,__s,__a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,__s,__a);
    DecPOMDPDiscrete::DecPOMDPDiscrete((DecPOMDPDiscrete *)local_2a0,local_2c0,local_2e8,local_30);
    std::__cxx11::string::~string(local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    MADPParser::MADPParser<DecPOMDPDiscrete>(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(local_2f3);
    PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(local_2f3,0));
    PlanningUnitMADPDiscreteParameters::SetComputeJointBeliefs(local_2f3,false);
    local_6c0 = (DecPOMDPDiscreteInterface *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x2a0) {
      local_6c0 = (DecPOMDPDiscreteInterface *)((long)local_2a0 + *(long *)(local_2a0[0] + -0x50));
    }
    NullPlanner::NullPlanner(local_630,(long)local_68,local_6c0,local_2f3);
    pIVar3 = (Interface_ProblemToPolicyDiscretePure *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x630) {
      pIVar3 = aIStack_608;
    }
    PolicyPureVector::PolicyPureVector(local_680,pIVar3,0,TYPE_INDEX,999999);
    PolicyPureVector::SetIndex((ulonglong)local_680);
    Policy::Print((Policy *)__a);
    PolicyPureVector::~PolicyPureVector(local_680);
    NullPlanner::~NullPlanner((NullPlanner *)0x102799);
    PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(local_2f3);
    MADPParser::~MADPParser(&local_2ea);
    DecPOMDPDiscrete::~DecPOMDPDiscrete((DecPOMDPDiscrete *)local_2a0);
    local_4 = 0;
    std::__cxx11::string::~string(local_30);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Use as follows: printPolicyPureVector ");
    poVar1 = std::operator<<(poVar1,"<problem> <horizon> <index>");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
    if(argc!=4)
    {
        cout << "Use as follows: printPolicyPureVector "
             << "<problem> <horizon> <index>" << endl;
        return(1);
    }

    // parse arguments
    string dpomdpFile=directories::MADPGetProblemFilename(argv[1]);
    int h=strtol(argv[2],0,10);
#if USE_ARBITRARY_PRECISION_INDEX
    LIndex index=*argv[3];
#else
    LIndex index=strtoull(argv[3],0,10);
#endif
    try {

    DecPOMDPDiscrete decpomdp("","",dpomdpFile);
    MADPParser parser(&decpomdp);
    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(true);
    params.SetComputeJointBeliefs(false);
    NullPlanner np(h, &decpomdp, &params);
    PolicyPureVector p(&np,0, PolicyGlobals::TYPE_INDEX);
    p.SetIndex(index);

    p.Print();

    }
    catch(E& e){ e.Print(); }

    return(0);
}